

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool __thiscall TestDiagnosticInternal::Run(TestDiagnosticInternal *this)

{
  Outputter *pOVar1;
  Cons<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_std::basic_ostream<char,_std::char_traits<char>_>_&(*)(std::basic_ostream<char,_std::char_traits<char>_>_&)>,_int>_>
  *in_RDX;
  Cons<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_std::ios_base_&(*)(std::ios_base_&)>,_int>_>
  *t;
  undefined1 auStack_68 [32];
  undefined1 local_48 [32];
  undefined4 local_28;
  
  pOVar1 = (this->super_Test).m_op;
  local_48._8_8_ = "Hello world ";
  local_48._16_4_ = 0x2a;
  local_48._24_8_ = std::endl<char,std::char_traits<char>>;
  local_28 = local_48._16_4_;
  testinator::
  Diagnostic<testinator::Cons<std::pair<std::pair<std::pair<std::pair<testinator::Nil,char_const*>,int>,std::ostream&(*)(std::ostream&)>,int>>>
            ((string *)auStack_68,(testinator *)local_48,in_RDX);
  (*pOVar1->_vptr_Outputter[3])(pOVar1,auStack_68);
  std::__cxx11::string::~string((string *)auStack_68);
  pOVar1 = (this->super_Test).m_op;
  auStack_68._8_8_ = "Hello world ";
  auStack_68._16_8_ = std::hex;
  auStack_68._24_4_ = 0x2a;
  testinator::
  Diagnostic<testinator::Cons<std::pair<std::pair<std::pair<testinator::Nil,char_const*>,std::ios_base&(*)(std::ios_base&)>,int>>>
            ((string *)local_48,(testinator *)auStack_68,t);
  (*pOVar1->_vptr_Outputter[3])(pOVar1,(string *)local_48);
  std::__cxx11::string::~string((string *)local_48);
  return true;
}

Assistant:

virtual bool Run()
  {
    DIAGNOSTIC("Hello world " << 42 << endl << 42);
    DIAGNOSTIC("Hello world " << std::hex << 42);
    return true;
  }